

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl.cpp
# Opt level: O0

Response * __thiscall
arbiter::http::Curl::post
          (Response *__return_storage_ptr__,Curl *this,string *path,
          vector<char,_std::allocator<char>_> *data,Headers *headers,Query *query,size_t timeout)

{
  CURL *pCVar1;
  int code;
  PutData *this_00;
  pointer pPVar2;
  size_type sVar3;
  undefined1 local_b8 [4];
  int httpCode;
  Headers receivedHeaders;
  vector<char,_std::allocator<char>_> writeData;
  unique_ptr<arbiter::http::(anonymous_namespace)::PutData,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
  putData;
  string local_58 [32];
  Query *local_38;
  Query *query_local;
  Headers *headers_local;
  vector<char,_std::allocator<char>_> *data_local;
  string *path_local;
  Curl *this_local;
  
  local_38 = query;
  query_local = headers;
  headers_local = (Headers *)data;
  data_local = (vector<char,_std::allocator<char>_> *)path;
  path_local = (string *)this;
  this_local = (Curl *)__return_storage_ptr__;
  ::std::__cxx11::string::string(local_58,(string *)path);
  init(this,(EVP_PKEY_CTX *)local_58);
  ::std::__cxx11::string::~string(local_58);
  if (timeout != 0) {
    curl_easy_setopt(this->m_curl,0x14,timeout);
  }
  this_00 = (PutData *)operator_new(0x10);
  anon_unknown_4::PutData::PutData(this_00,(vector<char,_std::allocator<char>_> *)headers_local);
  ::std::
  unique_ptr<arbiter::http::(anonymous_namespace)::PutData,std::default_delete<arbiter::http::(anonymous_namespace)::PutData>>
  ::unique_ptr<std::default_delete<arbiter::http::(anonymous_namespace)::PutData>,void>
            ((unique_ptr<arbiter::http::(anonymous_namespace)::PutData,std::default_delete<arbiter::http::(anonymous_namespace)::PutData>>
              *)&writeData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
             this_00);
  ::std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)
             &receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_node_count);
  curl_easy_setopt(this->m_curl,0x4e2c,anon_unknown_4::putCb);
  pCVar1 = this->m_curl;
  pPVar2 = ::std::
           unique_ptr<arbiter::http::(anonymous_namespace)::PutData,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
           ::get((unique_ptr<arbiter::http::(anonymous_namespace)::PutData,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
                  *)&writeData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  curl_easy_setopt(pCVar1,0x2719,pPVar2);
  curl_easy_setopt(this->m_curl,0x4e2b,anon_unknown_4::getCb);
  curl_easy_setopt(this->m_curl,0x2711,
                   &receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_node_count);
  curl_easy_setopt(this->m_curl,0x2727,this->m_headers);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_b8);
  curl_easy_setopt(this->m_curl,0x4e6f,anon_unknown_4::headerCb);
  curl_easy_setopt(this->m_curl,0x272d,local_b8);
  curl_easy_setopt(this->m_curl,0x2f,1);
  pCVar1 = this->m_curl;
  sVar3 = ::std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)headers_local);
  curl_easy_setopt(pCVar1,0x75a3,sVar3);
  code = perform(this);
  Response::Response(__return_storage_ptr__,code,
                     (vector<char,_std::allocator<char>_> *)
                     &receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (Headers *)local_b8);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_b8);
  ::std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             &receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ::std::
  unique_ptr<arbiter::http::(anonymous_namespace)::PutData,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
  ::~unique_ptr((unique_ptr<arbiter::http::(anonymous_namespace)::PutData,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
                 *)&writeData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  return __return_storage_ptr__;
}

Assistant:

Response Curl::post(
        std::string path,
        const std::vector<char>& data,
        Headers headers,
        Query query,
        const std::size_t timeout)
{
#ifdef ARBITER_CURL
    init(path, headers, query);
    if (timeout) curl_easy_setopt(m_curl, CURLOPT_LOW_SPEED_TIME, timeout);

    std::unique_ptr<PutData> putData(new PutData(data));
    std::vector<char> writeData;

    // Register callback function and data pointer to create the request.
    curl_easy_setopt(m_curl, CURLOPT_READFUNCTION, putCb);
    curl_easy_setopt(m_curl, CURLOPT_READDATA, putData.get());

    // Register callback function and data pointer to consume the result.
    curl_easy_setopt(m_curl, CURLOPT_WRITEFUNCTION, getCb);
    curl_easy_setopt(m_curl, CURLOPT_WRITEDATA, &writeData);

    // Insert all headers into the request.
    curl_easy_setopt(m_curl, CURLOPT_HTTPHEADER, m_headers);

    // Set up callback and data pointer for received headers.
    Headers receivedHeaders;
    curl_easy_setopt(m_curl, CURLOPT_HEADERFUNCTION, headerCb);
    curl_easy_setopt(m_curl, CURLOPT_HEADERDATA, &receivedHeaders);

    // Specify that this is a POST request.
    curl_easy_setopt(m_curl, CURLOPT_POST, 1L);

    // Must use this for binary data, otherwise curl will use strlen(), which
    // will likely be incorrect.
    curl_easy_setopt(
            m_curl,
            CURLOPT_INFILESIZE_LARGE,
            static_cast<curl_off_t>(data.size()));

    // Run the command.
    const int httpCode(perform());
    return Response(httpCode, writeData, receivedHeaders);
#else
    throw ArbiterError(fail);
#endif
}